

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_pairs.cpp
# Opt level: O3

void __thiscall Name_pairs::read_names(Name_pairs *this)

{
  char cVar1;
  int iVar2;
  long lVar3;
  string input;
  string local_90;
  string local_70;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter list of names delimited with comma:\n",0x2a);
  if (read_names()::delimeter_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&read_names()::delimeter_abi_cxx11_);
    if (iVar2 != 0) {
      read_names()::delimeter_abi_cxx11_._M_dataplus._M_p =
           (pointer)&read_names()::delimeter_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&read_names()::delimeter_abi_cxx11_,",","");
      __cxa_atexit(std::__cxx11::string::~string,&read_names()::delimeter_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&read_names()::delimeter_abi_cxx11_);
    }
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x80);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_70,cVar1);
  while( true ) {
    lVar3 = std::__cxx11::string::find
                      ((char *)&local_70,(ulong)read_names()::delimeter_abi_cxx11_._M_dataplus._M_p,
                       0);
    if (lVar3 == -1) break;
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_70);
    trim(&local_90,&local_50);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::erase((ulong)&local_70,0);
  }
  if (local_70._M_string_length != 0) {
    trim(&local_90,&local_70);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Name_pairs::read_names()
{
	std::cout << "Enter list of names delimited with comma:\n";
	static const std::string delimeter = ",";
	std::string input;
	std::getline(std::cin, input);
	size_t pos = 0;
	while ((pos = input.find(delimeter)) != std::string::npos)
	{
		name.push_back(trim(input.substr(0, pos)));
		input.erase(0, pos + 1);
	}
	// handle cases when there is one more name after delimiter
	if (!input.empty())
		name.push_back(trim(input));
}